

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_encoder.h
# Opt level: O0

void __thiscall
draco::DynamicIntegerPointsKdTreeEncoder<5>::
EncodeInternal<draco::PointDVector<unsigned_int>::PointDVectorIterator>
          (DynamicIntegerPointsKdTreeEncoder<5> *this,PointDVectorIterator begin,
          PointDVectorIterator end)

{
  PointDVectorIterator begin_00;
  PointDVectorIterator begin_;
  PointDVectorIterator end_;
  PointDVectorIterator end__00;
  PointDVectorIterator end__01;
  Splitter __pred;
  PointDVectorIterator __first;
  PointDVectorIterator __last;
  PointDVectorIterator begin__00;
  PointDVectorIterator end_00;
  PointDVectorIterator begin__01;
  PseudoPointD<unsigned_int> *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  undefined1 uVar1;
  bool bVar2;
  uint32_t uVar3;
  reference __x;
  const_reference pvVar4;
  size_t sVar5;
  reference pvVar6;
  reference pvVar7;
  size_t sVar8;
  DynamicIntegerPointsKdTreeEncoder<5> *in_RDI;
  size_t in_stack_00000008;
  DynamicIntegerPointsKdTreeEncoder<5> *in_stack_00000010;
  uint32_t in_stack_00000018;
  int in_stack_0000001c;
  DirectBitEncoder *in_stack_00000020;
  PointDVector<unsigned_int> *in_stack_00000028;
  uint32_t uStack0000000000000030;
  undefined4 uStack0000000000000034;
  bool left;
  uint32_t second_half;
  uint32_t first_half;
  int required_bits;
  PointDVectorIterator split;
  VectorUint32 *new_base;
  uint32_t modifier;
  uint32_t num_remaining_bits;
  uint32_t num_remaining_bits_1;
  uint32_t j;
  PseudoPointD<unsigned_int> *p;
  uint32_t i_1;
  uint32_t i;
  uint32_t num_remaining_points;
  uint32_t level;
  uint32_t axis;
  VectorUint32 *levels;
  VectorUint32 *old_base;
  uint32_t stack_pos;
  uint32_t last_axis;
  Status status;
  stack<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
  status_stack;
  Status init_status;
  uint32_t uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  int iVar12;
  DynamicIntegerPointsKdTreeEncoder<5> *pDVar13;
  EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator> *this_02;
  undefined4 in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb6c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffb70;
  DirectBitEncoder *this_03;
  size_type in_stack_fffffffffffffb78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffb80;
  undefined8 in_stack_fffffffffffffb88;
  undefined8 in_stack_fffffffffffffb90;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *this_04;
  undefined8 in_stack_fffffffffffffb98;
  uint32_t in_stack_fffffffffffffbd0;
  uint32_t in_stack_fffffffffffffbd4;
  undefined4 in_stack_fffffffffffffbe0;
  uint32_t in_stack_fffffffffffffbe4;
  value_type in_stack_fffffffffffffbe8;
  value_type in_stack_fffffffffffffbec;
  uint32_t in_stack_fffffffffffffbf0;
  undefined7 in_stack_fffffffffffffc00;
  undefined1 *puVar14;
  Splitter local_290 [5];
  size_t local_268;
  DynamicIntegerPointsKdTreeEncoder<5> *pDStack_260;
  PointDVectorIterator local_248;
  reference local_230;
  int local_228;
  int local_224;
  ulong local_220;
  uint32_t local_214;
  uint local_210;
  uint local_20c;
  PseudoPointD<unsigned_int> local_1f0;
  PseudoPointD<unsigned_int> *local_1e0;
  uint local_1d8;
  uint local_1d4;
  uint local_1d0;
  value_type local_1cc;
  uint32_t local_184;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_180;
  VectorUint32 *local_178;
  uint local_170;
  uint32_t local_16c;
  PointDVectorIterator local_168;
  PointDVectorIterator PStack_150;
  undefined8 local_138;
  ulong uStack_130;
  undefined4 local_54;
  undefined1 local_50 [44];
  undefined4 local_24;
  
  local_24 = 0;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x22c2fa);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
             (value_type_conflict5 *)in_stack_fffffffffffffb70,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::operator[](&in_RDI->base_stack_,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (in_stack_fffffffffffffb70,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_fffffffffffffb70);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x22c36b);
  local_54 = 0;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x22c39e);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
             (value_type_conflict5 *)in_stack_fffffffffffffb70,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::operator[](&in_RDI->levels_stack_,0);
  puVar14 = local_50;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (in_stack_fffffffffffffb70,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_fffffffffffffb70);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x22c416);
  begin__00.vec_ = in_stack_00000028;
  begin__00.item_ = (size_t)in_stack_00000020;
  begin__00.dimensionality_ = uStack0000000000000030;
  begin__00._20_4_ = uStack0000000000000034;
  uVar9 = (uint32_t)in_stack_00000008;
  uVar3 = (uint32_t)(in_stack_00000008 >> 0x20);
  end_.vec_ = (PointDVector<unsigned_int> *)in_stack_fffffffffffffb90;
  end_.item_ = in_stack_fffffffffffffb88;
  end_._16_8_ = in_stack_fffffffffffffb98;
  pDVar13 = in_stack_00000010;
  EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>::EncodingStatus
            ((EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator> *)
             in_stack_00000010,begin__00,end_,uVar3,uVar9);
  std::
  stack<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::deque<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>>>
  ::
  stack<std::deque<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>>,void>
            ((stack<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
              *)pDVar13);
  std::
  stack<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
  ::push((stack<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
          *)pDVar13,(value_type *)CONCAT44(uVar3,uVar9));
  while (uVar1 = std::
                 stack<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
                 ::empty((stack<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
                          *)0x22c4df), ((uVar1 ^ 0xff) & 1) != 0) {
    __x = std::
          stack<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
          ::top((stack<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
                 *)0x22c507);
    local_168.item_ = (__x->begin).item_;
    local_168.vec_ = (__x->begin).vec_;
    local_168.dimensionality_ = (__x->begin).dimensionality_;
    local_168._20_4_ = *(undefined4 *)&(__x->begin).field_0x14;
    PStack_150.item_ = (__x->end).item_;
    PStack_150.vec_ = (__x->end).vec_;
    PStack_150.dimensionality_ = (__x->end).dimensionality_;
    PStack_150._20_4_ = *(undefined4 *)&(__x->end).field_0x14;
    local_138._0_4_ = __x->last_axis;
    local_138._4_4_ = __x->num_remaining_points;
    uStack_130 = *(ulong *)&__x->stack_pos;
    std::
    stack<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
    ::pop((stack<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
           *)0x22c555);
    PointDVector<unsigned_int>::PointDVectorIterator::operator=
              ((PointDVectorIterator *)&stack0x00000008,&local_168);
    PointDVector<unsigned_int>::PointDVectorIterator::operator=
              ((PointDVectorIterator *)&stack0x00000020,&PStack_150);
    local_16c = (uint32_t)local_138;
    local_170 = (uint)uStack_130;
    local_178 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::operator[](&in_RDI->base_stack_,uStack_130 & 0xffffffff);
    local_180 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::operator[](&in_RDI->levels_stack_,(ulong)local_170);
    begin_00.vec_ = (PointDVector<unsigned_int> *)in_stack_00000010;
    begin_00.item_ = in_stack_00000008;
    begin_00.dimensionality_ = in_stack_00000018;
    end_00.vec_ = in_stack_00000028;
    end_00.item_ = (size_t)in_stack_00000020;
    end_00.dimensionality_ = uStack0000000000000030;
    end_00._20_4_ = uStack0000000000000034;
    uVar10 = (undefined4)in_stack_00000008;
    uVar11 = (undefined4)(in_stack_00000008 >> 0x20);
    begin_00._20_4_ = in_stack_0000001c;
    pDVar13 = in_stack_00000010;
    uVar9 = in_stack_00000018;
    iVar12 = in_stack_0000001c;
    this_03 = in_stack_00000020;
    uVar3 = GetAndEncodeAxis<draco::PointDVector<unsigned_int>::PointDVectorIterator>
                      (in_RDI,begin_00,end_00,local_178,local_180,local_16c);
    local_184 = uVar3;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (local_180,(ulong)uVar3);
    local_1cc = *pvVar4;
    sVar5 = PointDVector<unsigned_int>::PointDVectorIterator::operator-
                      ((PointDVectorIterator *)&stack0x00000020,
                       (PointDVectorIterator *)&stack0x00000008);
    local_1d0 = (uint)sVar5;
    if (in_RDI->bit_length_ != local_1cc) {
      if (local_1d0 < 3) {
        in_stack_fffffffffffffbf0 = local_184;
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&in_RDI->axes_,0);
        *pvVar6 = in_stack_fffffffffffffbf0;
        for (local_1d4 = 1; local_1d4 < in_RDI->dimension_; local_1d4 = local_1d4 + 1) {
          pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&in_RDI->axes_,(ulong)(local_1d4 - 1));
          if (*pvVar6 == in_RDI->dimension_ - 1) {
            in_stack_fffffffffffffbe8 = 0;
          }
          else {
            pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (&in_RDI->axes_,(ulong)(local_1d4 - 1));
            in_stack_fffffffffffffbe8 = *pvVar6 + 1;
          }
          in_stack_fffffffffffffbec = in_stack_fffffffffffffbe8;
          pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&in_RDI->axes_,(ulong)local_1d4);
          *pvVar6 = in_stack_fffffffffffffbe8;
        }
        for (local_1d8 = 0; local_1d8 < local_1d0; local_1d8 = local_1d8 + 1) {
          local_20c = local_1d8;
          PointDVector<unsigned_int>::PointDVectorIterator::operator+
                    ((PointDVectorIterator *)pDVar13,(int32_t *)CONCAT44(uVar11,uVar10));
          PointDVector<unsigned_int>::PointDVectorIterator::operator*
                    ((PointDVectorIterator *)CONCAT44(uVar11,uVar10));
          local_1e0 = &local_1f0;
          for (local_210 = 0; this_01 = local_180, local_210 < in_RDI->dimension_;
              local_210 = local_210 + 1) {
            in_stack_fffffffffffffbe4 = in_RDI->bit_length_;
            pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (&in_RDI->axes_,(ulong)local_210);
            pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (this_01,(ulong)*pvVar6);
            this_00 = local_1e0;
            uVar3 = in_stack_fffffffffffffbe4 - *pvVar4;
            local_214 = uVar3;
            if (uVar3 != 0) {
              pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                 (&in_RDI->axes_,(ulong)local_210);
              local_220 = (ulong)*pvVar6;
              PseudoPointD<unsigned_int>::operator[](this_00,&local_220);
              DirectBitEncoder::EncodeLeastSignificantBits32(this_03,iVar12,uVar9);
              in_stack_fffffffffffffbd4 = uVar3;
            }
          }
        }
      }
      else {
        local_224 = in_RDI->bit_length_ - local_1cc;
        local_228 = 1 << ((char)local_224 - 1U & 0x1f);
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::operator[](&in_RDI->base_stack_,(ulong)(local_170 + 1));
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(uVar1,in_stack_fffffffffffffc00),
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x);
        iVar12 = local_228;
        pvVar7 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[](&in_RDI->base_stack_,(ulong)(local_170 + 1));
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (pvVar7,(ulong)local_184);
        *pvVar6 = *pvVar6 + iVar12;
        local_230 = std::
                    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ::operator[](&in_RDI->base_stack_,(ulong)(local_170 + 1));
        uVar9 = local_184;
        local_268 = in_stack_00000008;
        pDStack_260 = in_stack_00000010;
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (local_230,(ulong)local_184);
        Splitter::Splitter(local_290,uVar9,*pvVar4);
        uVar9 = (uint32_t)local_268;
        iVar12 = (int)(local_268 >> 0x20);
        __first.item_._4_4_ = in_stack_fffffffffffffbe4;
        __first.item_._0_4_ = in_stack_fffffffffffffbe0;
        __first.vec_._0_4_ = in_stack_fffffffffffffbe8;
        __first.vec_._4_4_ = in_stack_fffffffffffffbec;
        __first.dimensionality_ = in_stack_fffffffffffffbf0;
        __first._20_4_ = uVar3;
        __last.vec_._0_7_ = in_stack_fffffffffffffc00;
        __last.item_ = (size_t)__x;
        __last.vec_._7_1_ = uVar1;
        __last._16_8_ = puVar14;
        __pred.value_ = in_stack_fffffffffffffbd4;
        __pred.axis_ = in_stack_fffffffffffffbd0;
        std::
        partition<draco::PointDVector<unsigned_int>::PointDVectorIterator,draco::DynamicIntegerPointsKdTreeEncoder<5>::Splitter>
                  (__first,__last,__pred);
        MostSignificantBit(local_1d0);
        sVar5 = PointDVector<unsigned_int>::PointDVectorIterator::operator-
                          (&local_248,(PointDVectorIterator *)&stack0x00000008);
        sVar8 = PointDVector<unsigned_int>::PointDVectorIterator::operator-
                          ((PointDVectorIterator *)&stack0x00000020,&local_248);
        if ((uint)sVar5 != (uint)sVar8) {
          DirectBitEncoder::EncodeBit((DirectBitEncoder *)pDStack_260,SUB41((uint)iVar12 >> 0x18,0))
          ;
        }
        if ((uint)sVar5 < (uint)sVar8) {
          EncodeNumber(pDStack_260,iVar12,uVar9);
        }
        else {
          EncodeNumber(pDStack_260,iVar12,uVar9);
        }
        this_04 = &in_RDI->levels_stack_;
        pvVar7 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[](this_04,(ulong)local_170);
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (pvVar7,(ulong)local_184);
        *pvVar6 = *pvVar6 + 1;
        pvVar7 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[](this_04,(ulong)local_170);
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::operator[](this_04,(ulong)(local_170 + 1));
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(uVar1,in_stack_fffffffffffffc00),
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x);
        bVar2 = PointDVector<unsigned_int>::PointDVectorIterator::operator!=
                          (&local_248,(PointDVectorIterator *)&stack0x00000008);
        if (bVar2) {
          uVar9 = (uint32_t)in_stack_00000008;
          uVar3 = (uint32_t)(in_stack_00000008 >> 0x20);
          begin_.vec_ = local_248.vec_;
          begin_.item_ = local_248.item_;
          begin_.dimensionality_ = local_248.dimensionality_;
          begin_._20_4_ = local_248._20_4_;
          end__00.vec_ = (PointDVector<unsigned_int> *)this_04;
          end__00.item_ = in_stack_fffffffffffffb88;
          end__00._16_8_ = pvVar7;
          pDVar13 = in_stack_00000010;
          EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>::EncodingStatus
                    ((EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator> *)
                     in_stack_00000010,begin_,end__00,uVar3,uVar9);
          std::
          stack<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
          ::push((stack<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
                  *)pDVar13,(value_type *)CONCAT44(uVar3,uVar9));
        }
        bVar2 = PointDVector<unsigned_int>::PointDVectorIterator::operator!=
                          (&local_248,(PointDVectorIterator *)&stack0x00000020);
        if (bVar2) {
          begin__01.vec_ = in_stack_00000028;
          begin__01.item_ = (size_t)in_stack_00000020;
          begin__01.dimensionality_ = uStack0000000000000030;
          begin__01._20_4_ = uStack0000000000000034;
          uVar9 = (uint32_t)local_248.item_;
          uVar3 = (uint32_t)(local_248.item_ >> 0x20);
          end__01.vec_ = (PointDVector<unsigned_int> *)this_04;
          end__01.item_ = in_stack_fffffffffffffb88;
          end__01._16_8_ = pvVar7;
          this_02 = (EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator> *)
                    local_248.vec_;
          EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>::EncodingStatus
                    ((EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator> *)
                     local_248.vec_,begin__01,end__01,uVar3,uVar9);
          std::
          stack<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
          ::push((stack<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
                  *)this_02,(value_type *)CONCAT44(uVar3,uVar9));
        }
      }
    }
  }
  std::
  stack<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
  ::~stack((stack<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
            *)0x22cea8);
  return;
}

Assistant:

void DynamicIntegerPointsKdTreeEncoder<compression_level_t>::EncodeInternal(
    RandomAccessIteratorT begin, RandomAccessIteratorT end) {
  typedef EncodingStatus<RandomAccessIteratorT> Status;

  base_stack_[0] = VectorUint32(dimension_, 0);
  levels_stack_[0] = VectorUint32(dimension_, 0);
  Status init_status(begin, end, 0, 0);
  std::stack<Status> status_stack;
  status_stack.push(init_status);

  // TODO(b/199760123): Use preallocated vector instead of stack.
  while (!status_stack.empty()) {
    Status status = status_stack.top();
    status_stack.pop();

    begin = status.begin;
    end = status.end;
    const uint32_t last_axis = status.last_axis;
    const uint32_t stack_pos = status.stack_pos;
    const VectorUint32 &old_base = base_stack_[stack_pos];
    const VectorUint32 &levels = levels_stack_[stack_pos];

    const uint32_t axis =
        GetAndEncodeAxis(begin, end, old_base, levels, last_axis);
    const uint32_t level = levels[axis];
    const uint32_t num_remaining_points = static_cast<uint32_t>(end - begin);

    // If this happens all axis are subdivided to the end.
    if ((bit_length_ - level) == 0) {
      continue;
    }

    // Fast encoding of remaining bits if number of points is 1 or 2.
    // Doing this also for 2 gives a slight additional speed up.
    if (num_remaining_points <= 2) {
      // TODO(b/199760123): |axes_| not necessary, remove would change
      // bitstream!
      axes_[0] = axis;
      for (uint32_t i = 1; i < dimension_; i++) {
        axes_[i] = DRACO_INCREMENT_MOD(axes_[i - 1], dimension_);
      }
      for (uint32_t i = 0; i < num_remaining_points; ++i) {
        const auto &p = *(begin + i);
        for (uint32_t j = 0; j < dimension_; j++) {
          const uint32_t num_remaining_bits = bit_length_ - levels[axes_[j]];
          if (num_remaining_bits) {
            remaining_bits_encoder_.EncodeLeastSignificantBits32(
                num_remaining_bits, p[axes_[j]]);
          }
        }
      }
      continue;
    }

    const uint32_t num_remaining_bits = bit_length_ - level;
    const uint32_t modifier = 1 << (num_remaining_bits - 1);
    base_stack_[stack_pos + 1] = old_base;  // copy
    base_stack_[stack_pos + 1][axis] += modifier;
    const VectorUint32 &new_base = base_stack_[stack_pos + 1];

    const RandomAccessIteratorT split =
        std::partition(begin, end, Splitter(axis, new_base[axis]));

    DRACO_DCHECK_EQ(true, (end - begin) > 0);

    // Encode number of points in first and second half.
    const int required_bits = MostSignificantBit(num_remaining_points);

    const uint32_t first_half = static_cast<uint32_t>(split - begin);
    const uint32_t second_half = static_cast<uint32_t>(end - split);
    const bool left = first_half < second_half;

    if (first_half != second_half) {
      half_encoder_.EncodeBit(left);
    }

    if (left) {
      EncodeNumber(required_bits, num_remaining_points / 2 - first_half);
    } else {
      EncodeNumber(required_bits, num_remaining_points / 2 - second_half);
    }

    levels_stack_[stack_pos][axis] += 1;
    levels_stack_[stack_pos + 1] = levels_stack_[stack_pos];  // copy
    if (split != begin) {
      status_stack.push(Status(begin, split, axis, stack_pos));
    }
    if (split != end) {
      status_stack.push(Status(split, end, axis, stack_pos + 1));
    }
  }
}